

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createCoordinatesTests(TestContext *testCtx)

{
  char *pcVar1;
  TestNode *node;
  size_t sVar2;
  int iVar3;
  undefined **ppuVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auStack_1f8 [8];
  TestNode *local_1f0;
  uint local_1e4;
  ulong local_1e0;
  _func_int **local_1d8;
  TestContext *local_1d0;
  long *local_1c8;
  long local_1b8 [2];
  char *local_1a8;
  undefined8 local_1a0;
  char local_198;
  undefined7 uStack_197;
  ios_base local_138 [264];
  
  local_1f0 = (TestNode *)operator_new(0x70);
  local_1d0 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f0,testCtx,"tesscoord","Tessellation coordinates tests");
  uVar6 = 0;
  local_1d8 = (_func_int **)&PTR__TestCase_00cec1f0;
  do {
    local_1e4 = (uint)uVar6;
    ppuVar4 = &PTR_anon_var_dwarf_15bb72c_00cffda0;
    iVar3 = 0;
    local_1e0 = uVar6;
    do {
      node = (TestNode *)operator_new(0x78);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      if ((uint)uVar6 < 3) {
        pcVar1 = *(char **)(&DAT_00cffd88 + local_1e0 * 8);
        sVar2 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar2);
      }
      else {
        std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8 + -0x18) + 0x50);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"_",1);
      pcVar1 = *ppuVar4;
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar1,sVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1a0 = 0;
      local_198 = '\0';
      local_1a8 = &local_198;
      tcu::TestCase::TestCase((TestCase *)node,local_1d0,(char *)local_1c8,&local_198);
      node->_vptr_TestNode = local_1d8;
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
      }
      uVar5 = local_1e4;
      uVar6 = (ulong)local_1e4;
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cffcf8;
      *(uint *)&node[1]._vptr_TestNode = uVar5;
      *(int *)((long)&node[1]._vptr_TestNode + 4) = iVar3;
      tcu::TestNode::addChild(local_1f0,node);
      iVar3 = iVar3 + 1;
      ppuVar4 = ppuVar4 + 1;
    } while (iVar3 != 3);
    uVar5 = uVar5 + 1;
    uVar6 = (ulong)uVar5;
  } while (uVar5 != 3);
  return (TestCaseGroup *)local_1f0;
}

Assistant:

tcu::TestCaseGroup* createCoordinatesTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "tesscoord", "Tessellation coordinates tests"));

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
		group->addChild(new TessCoordTest(testCtx, (TessPrimitiveType)primitiveTypeNdx, (SpacingMode)spacingModeNdx));

	return group.release();
}